

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O1

string * utilities::trim(string *__return_storage_ptr__,string *s)

{
  string local_30;
  
  ltrim(&local_30,s);
  rtrim(__return_storage_ptr__,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string trim(const std::string& s)
    {
        return rtrim(ltrim(s));
    }